

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O0

uint64_t helper_neon_widen_s8_arm(uint32_t x)

{
  uint64_t ret;
  uint64_t tmp;
  uint32_t x_local;
  
  return (ulong)((int)(char)(x >> 0x18) & 0xffff) << 0x30 |
         (ulong)((int)(char)(x >> 0x10) & 0xffff) << 0x20 |
         (ulong)((int)(char)(x >> 8) & 0xffff) << 0x10 | (ulong)((int)(char)x & 0xffff);
}

Assistant:

uint64_t HELPER(neon_widen_s8)(uint32_t x)
{
    uint64_t tmp;
    uint64_t ret;
    ret = (uint16_t)(int8_t)x;
    tmp = (uint16_t)(int8_t)(x >> 8);
    ret |= tmp << 16;
    tmp = (uint16_t)(int8_t)(x >> 16);
    ret |= tmp << 32;
    tmp = (uint16_t)(int8_t)(x >> 24);
    ret |= tmp << 48;
    return ret;
}